

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

void __thiscall
EOPlus::Parser_Token_Server_Base::Parser_Token_Server_Base(Parser_Token_Server_Base *this)

{
  variant local_50;
  
  this->_vptr_Parser_Token_Server_Base = (_func_int **)&PTR___cxa_pure_virtual_001d3708;
  (this->token_buffer).c.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->token_buffer).c.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->token_buffer).c.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->token_buffer).c.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->token_buffer).c.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->token_buffer).c.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->token_buffer).c.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->token_buffer).c.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->token_buffer).c.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->token_buffer).c.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>::_M_initialize_map
            ((_Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_> *)&this->token_buffer,0);
  this->line = 1;
  util::variant::variant(&local_50);
  (this->reject_token).type = Invalid;
  (this->reject_token).data.val_int = local_50.val_int;
  *(undefined4 *)&(this->reject_token).data.field_0x4 = local_50._4_4_;
  *(undefined4 *)&(this->reject_token).data.val_float = local_50.val_float._0_4_;
  *(undefined4 *)((long)&(this->reject_token).data.val_float + 4) = local_50.val_float._4_4_;
  (this->reject_token).data.val_string._M_dataplus._M_p =
       (pointer)&(this->reject_token).data.val_string.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->reject_token).data.val_string,local_50.val_string._M_dataplus._M_p,
             local_50.val_string._M_dataplus._M_p + local_50.val_string._M_string_length);
  (this->reject_token).data.type = local_50.type;
  (this->reject_token).data.val_bool = local_50.val_bool;
  (this->reject_token).data.cache_val[0] = local_50.cache_val[0];
  (this->reject_token).data.cache_val[1] = local_50.cache_val[1];
  (this->reject_token).data.cache_val[2] = local_50.cache_val[2];
  (this->reject_token).data.cache_val[3] = local_50.cache_val[3];
  *(undefined3 *)&(this->reject_token).data.field_0x35 = local_50._53_3_;
  (this->reject_token).newlines = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.val_string._M_dataplus._M_p != &local_50.val_string.field_2) {
    operator_delete(local_50.val_string._M_dataplus._M_p,
                    local_50.val_string.field_2._M_allocated_capacity + 1);
  }
  this->reject_line = 1;
  return;
}

Assistant:

Parser_Token_Server_Base::Parser_Token_Server_Base()
		: line(1)
		, reject_line(1)
	{ }